

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O3

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Ellipsoid::getBoundingBox(Ellipsoid *this)

{
  double dVar1;
  double dVar2;
  uint i;
  long lVar3;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *in_RDI;
  undefined4 uVar4;
  undefined4 uVar5;
  Vector<double,_3U> result;
  Vector3d r;
  
  dVar1 = this->rAxial_;
  uVar4 = SUB84(dVar1,0);
  uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
  dVar2 = this->rEquatorial_;
  if (dVar1 <= dVar2) {
    uVar4 = SUB84(dVar2,0);
    uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  r.super_Vector<double,_3U>.data_[0] = (double)CONCAT44(uVar5,uVar4);
  r.super_Vector<double,_3U>.data_[1] = (double)CONCAT44(uVar5,uVar4);
  r.super_Vector<double,_3U>.data_[2] = (double)CONCAT44(uVar5,uVar4);
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result.data_[lVar3] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar3] -
         r.super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (in_RDI->first).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (in_RDI->first).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (in_RDI->first).super_Vector<double,_3U>.data_[1] = result.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result.data_[lVar3] =
         (this->origin_).super_Vector<double,_3U>.data_[lVar3] +
         r.super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (in_RDI->second).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (in_RDI->second).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (in_RDI->second).super_Vector<double,_3U>.data_[1] = result.data_[1];
  return in_RDI;
}

Assistant:

std::pair<Vector3d, Vector3d> Ellipsoid::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    // make a cubic box
    RealType rad = rAxial_ > rEquatorial_ ? rAxial_ : rEquatorial_;
    Vector3d r(rad, rad, rad);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }